

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

any * __thiscall
Omega_h::InputYamlReader::map_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *key_any,any *value_any)

{
  shared_ptr<Omega_h::Input> *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  type_info *ptVar3;
  InputScalar *this_01;
  InputList *pIVar4;
  InputMap *pIVar5;
  ParserFail *this_02;
  allocator local_91;
  string value;
  NameValue result;
  
  result.name._M_dataplus._M_p = (pointer)&result.name.field_2;
  result.name._M_string_length = 0;
  result.name.field_2._M_local_buf[0] = '\0';
  result.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  result.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar2 = any_cast<std::__cxx11::string&&>(key_any);
  std::__cxx11::string::operator=((string *)&result,(string *)pbVar2);
  if (value_any->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*value_any->vtable->type)();
  }
  this_00 = &result.value;
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    pbVar2 = any_cast<std::__cxx11::string&&>(value_any);
    std::__cxx11::string::string((string *)&value,(string *)pbVar2);
    this_01 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar(this_01,&value);
    std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputScalar>
              (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,this_01);
    std::__cxx11::string::~string((string *)&value);
  }
  else {
    if (value_any->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*value_any->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputList::typeinfo);
    if (bVar1) {
      pIVar4 = any_cast<Omega_h::InputList&&>(value_any);
      InputList::InputList((InputList *)&value,pIVar4);
      pIVar4 = (InputList *)operator_new(0x30);
      InputList::InputList(pIVar4,(InputList *)&value);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputList>
                (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,pIVar4);
      InputList::~InputList((InputList *)&value);
    }
    else {
      if (value_any->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*value_any->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&value,"unexpected YAML map value type ",&local_91);
        if (value_any->vtable != (vtable_type *)0x0) {
          (*value_any->vtable->type)();
        }
        std::__cxx11::string::append((char *)&value);
        std::__cxx11::string::append((char *)&value);
        std::__cxx11::string::append((string *)&value);
        std::__cxx11::string::append((char *)&value);
        this_02 = (ParserFail *)__cxa_allocate_exception(0x10);
        ParserFail::ParserFail(this_02,&value);
        __cxa_throw(this_02,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      pIVar5 = any_cast<Omega_h::InputMap&&>(value_any);
      InputMap::InputMap((InputMap *)&value,pIVar5);
      pIVar5 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(pIVar5,(InputMap *)&value);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputMap>
                (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,pIVar5);
      InputMap::~InputMap((InputMap *)&value);
    }
  }
  any::construct<Omega_h::NameValue>(__return_storage_ptr__,&result);
  NameValue::~NameValue(&result);
  return __return_storage_ptr__;
}

Assistant:

any map_item(any& key_any, any& value_any) {
    NameValue result;
    result.name = any_cast<std::string&&>(std::move(key_any));
    if (value_any.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(value_any));
      result.value.reset(new InputScalar(value));
    } else if (value_any.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(value_any));
      result.value.reset(new InputList(std::move(value)));
    } else if (value_any.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(value_any));
      result.value.reset(new InputMap(std::move(value)));
    } else {
      std::string msg = "unexpected YAML map value type ";
      msg += value_any.type().name();
      msg += " for name \"";
      msg += result.name;
      msg += "\"\n";
      throw ParserFail(msg);
    }
    return any(std::move(result));
  }